

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_4::ComputeStiffnessMatrix(ChElementTetraCorot_4 *this)

{
  ChMatrixDynamic<> *pCVar1;
  Scalar SVar2;
  double dVar3;
  undefined1 auVar4 [16];
  Scalar *pSVar5;
  long lVar6;
  ChLog *this_00;
  ChStreamOutAscii *pCVar7;
  int col;
  long row_00;
  ulong col_00;
  int row;
  ulong row_01;
  long col_01;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ChMatrixNM<double,_4,_4> tmp;
  double local_1c0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  local_1b0;
  ChMatrixDynamic<> *local_180;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_178;
  Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_140;
  Matrix<double,_4,_4,_1,_4,_4> local_100;
  
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_178);
  lVar9 = 1;
  local_1b0._0_8_ = &local_178;
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,&local_100,0,0
             ,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1b0);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_178);
  local_1b0._0_8_ = &local_178;
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,&local_100,0,1
             ,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1b0);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_178);
  local_1b0._0_8_ = &local_178;
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,&local_100,0,2
             ,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1b0);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_178);
  local_1b0._0_8_ = &local_178;
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,&local_100,0,3
             ,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> *)&local_140,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1b0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true,_true> *)
                  &local_140,&local_100,3);
  local_178.m_lhs._0_8_ = 0x3ff0000000000000;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true>_>::setConstant
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true>_> *)
             &local_140,(Scalar *)&local_178);
  local_140.m_lhs.m_lhs._0_8_ = &local_100;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,4,4,1,4,4>,Eigen::Inverse<Eigen::Matrix<double,4,4,1,4,4>>>
            (&this->mM,(Inverse<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)&local_140);
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0];
  pCVar1 = &this->MatrB;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[4];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,3);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[8];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,6);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0xc];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,9);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[1];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0xd);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[5];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x10);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[9];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x13);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0xd];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x16);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[2];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x1a);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[6];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x1d);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[10];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x20);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0xe];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x23);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[1];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x24);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x25);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[5];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x27);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[4];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x28);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[9];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x2a);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[8];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x2b);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0xd];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x2d);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0xc];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x2e);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[2];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x31);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[1];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x32);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[6];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x34);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[5];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x35);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[10];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x37);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[9];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x38);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0xe];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x3a);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0xd];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x3b);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[2];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x3c);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x3e);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[6];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x3f);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[4];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x41);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[10];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x42);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[8];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x44);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0xe];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x45);
  *pSVar5 = SVar2;
  SVar2 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0xc];
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,0x47);
  *pSVar5 = SVar2;
  local_180 = pCVar1;
  Eigen::operator*(&local_1b0,&this->Volume,(StorageBaseType *)&local_180);
  Eigen::
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>
  ::Product(&local_178,&local_1b0,
            &((this->Material).
              super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->StressStrainMatrix);
  Eigen::
  Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0>
  ::Product(&local_140,&local_178,pCVar1);
  pCVar1 = &this->StiffnessMatrix;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>const>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
            (pCVar1,&local_140);
  for (col_01 = 0;
      lVar6 = (this->StiffnessMatrix).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows,
      row_00 = lVar9, col_01 < lVar6 + -1; col_01 = col_01 + 1) {
    for (; row_00 < (this->StiffnessMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_cols; row_00 = row_00 + 1) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,
                          row_00,col_01);
      SVar2 = *pSVar5;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,
                          col_01,row_00);
      *pSVar5 = SVar2;
    }
    lVar9 = lVar9 + 1;
  }
  uVar10 = 0xffffffffffffffff;
  local_1c0 = 0.0;
  uVar8 = 0xffffffff;
  for (row_01 = 0; (long)row_01 < lVar6; row_01 = row_01 + 1) {
    for (col_00 = 0;
        (long)col_00 <
        (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_cols; col_00 = col_00 + 1) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,
                          row_01,col_00);
      dVar3 = *pSVar5;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)pCVar1,
                          col_00,row_01);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_1c0;
      auVar4._8_8_ = 0x7fffffffffffffff;
      auVar4._0_8_ = 0x7fffffffffffffff;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar3 - *pSVar5;
      auVar11 = vandpd_avx512vl(auVar11,auVar4);
      auVar4 = vmaxsd_avx(auVar11,auVar12);
      if (local_1c0 < auVar11._0_8_) {
        uVar10 = row_01;
      }
      uVar10 = uVar10 & 0xffffffff;
      if (local_1c0 < auVar11._0_8_) {
        uVar8 = col_00 & 0xffffffff;
      }
      local_1c0 = auVar4._0_8_;
    }
    lVar6 = (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
            .m_storage.m_rows;
  }
  if (1e-10 < local_1c0) {
    this_00 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<
                       (&this_00->super_ChStreamOutAscii,"NONSYMMETRIC local stiffness matrix! err "
                       );
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,local_1c0);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7," at ");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,(int)uVar10);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,",");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,(int)uVar8);
    ChStreamOutAscii::operator<<(pCVar7,"\n");
  }
  return;
}

Assistant:

void ChElementTetraCorot_4::ComputeStiffnessMatrix() {
    // M = [ X0_0 X0_1 X0_2 X0_3 ] ^-1
    //     [ 1    1    1    1    ]
    ChMatrixNM<double, 4, 4> tmp;
    tmp.block(0, 0, 3, 1) = nodes[0]->GetX0().eigen();
    tmp.block(0, 1, 3, 1) = nodes[1]->GetX0().eigen();
    tmp.block(0, 2, 3, 1) = nodes[2]->GetX0().eigen();
    tmp.block(0, 3, 3, 1) = nodes[3]->GetX0().eigen();
    tmp.row(3).setConstant(1.0);
    mM = tmp.inverse();

    ////MatrB.Reset(6, 12);
    MatrB(0) = mM(0);
    MatrB(3) = mM(4);
    MatrB(6) = mM(8);
    MatrB(9) = mM(12);
    MatrB(13) = mM(1);
    MatrB(16) = mM(5);
    MatrB(19) = mM(9);
    MatrB(22) = mM(13);
    MatrB(26) = mM(2);
    MatrB(29) = mM(6);
    MatrB(32) = mM(10);
    MatrB(35) = mM(14);
    MatrB(36) = mM(1);
    MatrB(37) = mM(0);
    MatrB(39) = mM(5);
    MatrB(40) = mM(4);
    MatrB(42) = mM(9);
    MatrB(43) = mM(8);
    MatrB(45) = mM(13);
    MatrB(46) = mM(12);
    MatrB(49) = mM(2);
    MatrB(50) = mM(1);
    MatrB(52) = mM(6);
    MatrB(53) = mM(5);
    MatrB(55) = mM(10);
    MatrB(56) = mM(9);
    MatrB(58) = mM(14);
    MatrB(59) = mM(13);
    MatrB(60) = mM(2);
    MatrB(62) = mM(0);
    MatrB(63) = mM(6);
    MatrB(65) = mM(4);
    MatrB(66) = mM(10);
    MatrB(68) = mM(8);
    MatrB(69) = mM(14);
    MatrB(71) = mM(12);

    StiffnessMatrix = Volume * MatrB.transpose() * Material->Get_StressStrainMatrix() * MatrB;

    // ***TEST*** SYMMETRIZE TO AVOID ROUNDOFF ASYMMETRY
    for (int row = 0; row < StiffnessMatrix.rows() - 1; ++row)
        for (int col = row + 1; col < StiffnessMatrix.cols(); ++col)
            StiffnessMatrix(row, col) = StiffnessMatrix(col, row);

    double max_err = 0;
    int err_r = -1;
    int err_c = -1;
    for (int row = 0; row < StiffnessMatrix.rows(); ++row)
        for (int col = 0; col < StiffnessMatrix.cols(); ++col) {
            double diff = fabs(StiffnessMatrix(row, col) - StiffnessMatrix(col, row));
            if (diff > max_err) {
                max_err = diff;
                err_r = row;
                err_c = col;
            }
        }
    if (max_err > 1e-10)
        GetLog() << "NONSYMMETRIC local stiffness matrix! err " << max_err << " at " << err_r << "," << err_c << "\n";
}